

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalMapping::MergeFrom
          (CategoricalMapping *this,CategoricalMapping *from)

{
  CategoricalMapping *pCVar1;
  bool bVar2;
  MappingTypeCase MVar3;
  ValueOnUnknownCase VVar4;
  LogMessage *other;
  StringToInt64Map *this_00;
  StringToInt64Map *from_00;
  Int64ToStringMap *this_01;
  Int64ToStringMap *from_01;
  string *value;
  Arena *pAVar5;
  int64_t value_00;
  LogFinisher local_75;
  uint32_t cached_has_bits;
  byte local_61;
  LogMessage local_60;
  CategoricalMapping *local_28;
  CategoricalMapping *from_local;
  CategoricalMapping *this_local;
  CategoricalMapping *local_10;
  
  local_61 = 0;
  local_28 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/CategoricalMapping.pb.cc"
               ,399);
    local_61 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_75,other);
  }
  if ((local_61 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  MVar3 = MappingType_case(local_28);
  if (MVar3 != MAPPINGTYPE_NOT_SET) {
    if (MVar3 == kStringToInt64Map) {
      this_00 = _internal_mutable_stringtoint64map(this);
      from_00 = _internal_stringtoint64map(local_28);
      StringToInt64Map::MergeFrom(this_00,from_00);
    }
    else if (MVar3 == kInt64ToStringMap) {
      this_01 = _internal_mutable_int64tostringmap(this);
      from_01 = _internal_int64tostringmap(local_28);
      Int64ToStringMap::MergeFrom(this_01,from_01);
    }
  }
  VVar4 = ValueOnUnknown_case(local_28);
  if (VVar4 != VALUEONUNKNOWN_NOT_SET) {
    if (VVar4 == kStrValue) {
      this_local = (CategoricalMapping *)_internal_strvalue_abi_cxx11_(local_28);
      local_10 = this;
      bVar2 = _internal_has_strvalue(this);
      if (!bVar2) {
        clear_ValueOnUnknown(this);
        set_has_strvalue(this);
        value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
        google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
                  (&(this->ValueOnUnknown_).strvalue_,value);
      }
      pCVar1 = this_local;
      pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)&this->ValueOnUnknown_,pCVar1,pAVar5);
    }
    else if (VVar4 == kInt64Value) {
      value_00 = _internal_int64value(local_28);
      _internal_set_int64value(this,value_00);
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_28->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CategoricalMapping::MergeFrom(const CategoricalMapping& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CategoricalMapping)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.MappingType_case()) {
    case kStringToInt64Map: {
      _internal_mutable_stringtoint64map()->::CoreML::Specification::StringToInt64Map::MergeFrom(from._internal_stringtoint64map());
      break;
    }
    case kInt64ToStringMap: {
      _internal_mutable_int64tostringmap()->::CoreML::Specification::Int64ToStringMap::MergeFrom(from._internal_int64tostringmap());
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  switch (from.ValueOnUnknown_case()) {
    case kStrValue: {
      _internal_set_strvalue(from._internal_strvalue());
      break;
    }
    case kInt64Value: {
      _internal_set_int64value(from._internal_int64value());
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}